

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

error_code __thiscall
slang::SourceManager::addSystemDirectories(SourceManager *this,string_view pattern)

{
  pointer ctx;
  error_code eVar1;
  string_view pattern_00;
  error_code ec;
  unique_lock<std::shared_mutex> lock;
  SmallVector<std::filesystem::__cxx11::path,_2UL> dirs;
  error_code *in_stack_ffffffffffffff30;
  uint local_c8 [2];
  error_category *local_c0;
  undefined1 local_b8 [40];
  SmallVectorBase<std::filesystem::__cxx11::path> local_90;
  
  pattern_00._M_len = pattern._M_str;
  local_90.data_ = (pointer)local_90.firstElement;
  local_90.len = 0;
  local_90.cap = 2;
  local_c8[0] = 0;
  local_c0 = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::path((path *)local_b8);
  pattern_00._M_str = (char *)0x1;
  svGlob((slang *)local_b8,(path *)pattern._M_len,pattern_00,(GlobMode)&local_90,
         (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x0,SUB81(local_c8,0),
         in_stack_ffffffffffffff30);
  std::filesystem::__cxx11::path::~path((path *)local_b8);
  local_b8._0_8_ = &this->includeDirMutex;
  local_b8[8] = false;
  std::unique_lock<std::shared_mutex>::lock((unique_lock<std::shared_mutex> *)local_b8);
  local_b8[8] = true;
  ctx = (this->systemDirectories).
        super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
  _M_range_insert<std::filesystem::__cxx11::path*>
            ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
              *)&this->systemDirectories,ctx,local_90.data_,local_90.data_ + local_90.len);
  std::unique_lock<std::shared_mutex>::~unique_lock((unique_lock<std::shared_mutex> *)local_b8);
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup(&local_90,(EVP_PKEY_CTX *)ctx);
  eVar1._4_4_ = 0;
  eVar1._M_value = local_c8[0];
  eVar1._M_cat = local_c0;
  return eVar1;
}

Assistant:

std::error_code SourceManager::addSystemDirectories(std::string_view pattern) {
    SmallVector<fs::path> dirs;
    std::error_code ec;
    svGlob({}, pattern, GlobMode::Directories, dirs, /* expandEnvVars */ false, ec);

    // Note: locking the separate mutex for include dirs here.
    std::unique_lock<std::shared_mutex> lock(includeDirMutex);
    systemDirectories.insert(systemDirectories.end(), dirs.begin(), dirs.end());
    return ec;
}